

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_pars.h
# Opt level: O3

void lowmc_compute(lowmc_parameters_t *lowmc,lowmc_key_t *key,mzd_local_t *x,mzd_local_t *y)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  lowmc_partial_round_t *plVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  mzd_local_t mStack_100;
  mzd_local_t mStack_e0;
  mzd_local_t mStack_c0;
  undefined1 auStack_a0 [32];
  mzd_local_t amStack_80 [2];
  
  uVar4 = (uint)lowmc->n << 0x10 | (uint)lowmc->m;
  mStack_c0.w64[3] = (word)y;
  if ((~DAT_0019608c & 0x20400) != 0) {
    if (0xc0003f < (int)uVar4) {
      if (uVar4 == 0xc00040) {
        mStack_e0.w64[3] = 0x105f3a;
        mzd_copy_s128_256((mzd_local_t *)auStack_a0,x);
        mStack_e0.w64[3] = 0x105f53;
        mzd_addmul_v_s128_192((mzd_local_t *)auStack_a0,key,K_0);
        lVar6 = 0;
        do {
          auVar13 = vandpd_avx(auStack_a0._0_16_,_DAT_0010d840);
          auVar21 = vpand_avx(auStack_a0._16_16_,_DAT_0010d7f0);
          auVar14 = vandpd_avx(auStack_a0._0_16_,_DAT_0010d850);
          auVar10 = vpand_avx(auStack_a0._16_16_,_DAT_0010d810);
          auVar22 = vandpd_avx(auStack_a0._0_16_,_DAT_0010d860);
          auVar2 = vpand_avx(auStack_a0._16_16_,_DAT_0010d830);
          auVar16 = vpsrldq_avx(auStack_a0._0_16_,8);
          auVar20 = vpsrldq_avx(auVar13,8);
          auVar16 = vpshldq_avx512_vbmi2(auVar10,auVar16,1);
          auVar14 = vpaddq_avx(auVar14,auVar14);
          auVar20 = vpshldq_avx512_vbmi2(auVar21,auVar20,2);
          auVar21 = vpslldq_avx(auVar13,8);
          auVar11 = vpshldq_avx512_vbmi2(auVar13,auVar21,2);
          auVar13 = vpand_avx(auVar20,auVar2);
          auVar21 = vpand_avx(auVar11,auVar22);
          auVar10 = vpor_avx(auVar11,auVar14);
          auVar13 = vpternlogq_avx512vl(auVar13,auVar16,auVar20,0x96);
          auVar21 = vpternlogq_avx512vl(auVar21,auVar14,auVar11,0x96);
          auVar14 = vpternlogq_avx512vl(auVar11,auVar14,auVar22,0x78);
          auVar11 = vpternlogq_avx512vl(auVar20,auVar16,auVar2,0x78);
          auVar23 = vpsrldq_avx(auVar14,8);
          auVar12 = vpslldq_avx(auVar11,8);
          auVar11 = vpsrlq_avx(auVar11,2);
          auVar14 = vpshldq_avx512_vbmi2(auVar23,auVar14,0x3e);
          auVar12 = vpsllq_avx(auVar12,0x3e);
          auVar16 = vpternlogq_avx512vl(auVar11,auVar16,auVar20,0xfe);
          auVar14 = vpternlogq_avx512vl(auVar14,auVar10,auVar12,0x36);
          auVar20 = vpslldq_avx(auVar13,8);
          auVar10 = vpsrlq_avx(auVar13,1);
          auVar13 = vpshldq_avx512_vbmi2(auVar20,auVar21,0x3f);
          auStack_a0._16_16_ = vpternlogq_avx512vl(auVar16,auVar2,auVar10,0x96);
          auStack_a0._0_16_ = vpternlogq_avx512vl(auVar13,auVar22,auVar14,0x96);
          mStack_e0.w64[3] = 0x10604f;
          mzd_mul_v_s128_192(amStack_80,(mzd_local_t *)auStack_a0,
                             *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar6));
          mStack_e0.w64[3] = 0x10605f;
          mzd_xor_s128_256((mzd_local_t *)auStack_a0,amStack_80,
                           *(mzd_local_t **)((long)&rounds[0].constant + lVar6));
          mStack_e0.w64[3] = 0x10606f;
          mzd_addmul_v_s128_192
                    ((mzd_local_t *)auStack_a0,key,
                     *(mzd_local_t **)((long)&rounds[0].k_matrix + lVar6));
          lVar6 = lVar6 + 0x20;
        } while ((int)lVar6 != 0x80);
        mStack_e0.w64[3] = 0x10608e;
        mzd_copy_s128_256((mzd_local_t *)mStack_c0.w64[3],(mzd_local_t *)auStack_a0);
        return;
      }
      if (uVar4 != 0xff0055) {
        lowmc_s128_lowmc_256_256_38(key,x,y);
        return;
      }
      mStack_e0.w64[3] = 0x1060ca;
      mzd_copy_s128_256((mzd_local_t *)auStack_a0,x);
      mStack_e0.w64[3] = 0x1060e3;
      mzd_addmul_v_s128_256((mzd_local_t *)auStack_a0,key,K_0);
      lVar6 = 0;
      do {
        auVar13 = vandpd_avx(auStack_a0._16_16_,_DAT_0010d840);
        auVar14 = vandpd_avx(auStack_a0._0_16_,_DAT_0010d850);
        auVar22 = vandpd_avx(auStack_a0._16_16_,_DAT_0010d860);
        auVar21 = vandpd_avx(auStack_a0._0_16_,_DAT_0010d860);
        auVar10 = vandpd_avx(auStack_a0._0_16_,_DAT_0010d870);
        auVar2 = vandpd_avx(auStack_a0._16_16_,_DAT_0010d850);
        auVar16 = vpslldq_avx(auStack_a0._16_16_,8);
        auVar11 = vpslldq_avx(auVar22,8);
        auVar20 = vpsrldq_avx(auVar14,8);
        auVar16 = vpshldq_avx512_vbmi2(auVar13,auVar16,1);
        auVar12 = vpsllq_avx(auVar14,2);
        auVar13 = vpaddq_avx(auVar21,auVar21);
        auVar14 = vpshldq_avx512_vbmi2(auVar22,auVar11,2);
        auVar22 = vpsrlq_avx(auVar20,0x3e);
        auVar22 = vpor_avx(auVar14,auVar22);
        auVar14 = vpand_avx(auVar22,auVar2);
        auVar21 = vpternlogq_avx512vl(auVar22,auVar16,auVar2,0x78);
        auVar20 = vpternlogq_avx512vl(auVar14,auVar16,auVar22,0x96);
        auVar23 = vpslldq_avx(auVar21,8);
        auVar14 = vpsrldq_avx(auVar21,8);
        auVar21 = vpshldq_avx512_vbmi2(auVar14,auVar21,0x3e);
        auVar25 = vpslldq_avx(auVar20,8);
        auVar24 = vpsrldq_avx(auVar20,8);
        auVar14 = vpand_avx(auVar12,auVar10);
        auVar11 = vpternlogq_avx512vl(auVar12,auVar13,auVar10,0x78);
        auVar20 = vpshldq_avx512_vbmi2(auVar24,auVar20,0x3f);
        auVar14 = vpternlogq_avx512vl(auVar14,auVar13,auVar12,0x96);
        auVar11 = vpshldq_avx512_vbmi2(auVar23,auVar11,0x3e);
        auVar22 = vpternlogq_avx512vl(auVar21,auVar22,auVar16,0x1e);
        auVar14 = vpshldq_avx512_vbmi2(auVar25,auVar14,0x3f);
        auStack_a0._16_16_ = vpternlogq_avx512vl(auVar22,auVar2,auVar20,0x96);
        auVar13 = vpternlogq_avx512vl(auVar11,auVar12,auVar13,0x1e);
        auStack_a0._0_16_ = vpternlogq_avx512vl(auVar13,auVar10,auVar14,0x96);
        mStack_e0.w64[3] = 0x1061eb;
        mzd_mul_v_s128_256(amStack_80,(mzd_local_t *)auStack_a0,
                           *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar6));
        mStack_e0.w64[3] = 0x1061fb;
        mzd_xor_s128_256((mzd_local_t *)auStack_a0,amStack_80,
                         *(mzd_local_t **)((long)&rounds[0].constant + lVar6));
        mStack_e0.w64[3] = 0x10620b;
        mzd_addmul_v_s128_256
                  ((mzd_local_t *)auStack_a0,key,
                   *(mzd_local_t **)((long)&rounds[0].k_matrix + lVar6));
        lVar6 = lVar6 + 0x20;
      } while ((int)lVar6 != 0x80);
      mStack_e0.w64[3] = 0x10622a;
      mzd_copy_s128_256((mzd_local_t *)mStack_c0.w64[3],(mzd_local_t *)auStack_a0);
      return;
    }
    if (uVar4 == 0x80000a) {
      mzd_xor_s128_128(&mStack_100,x,precomputed_constant_linear_part);
      plVar9 = rounds;
      mzd_addmul_v_s128_128(&mStack_100,key,precomputed_round_key_matrix_linear_part);
      mzd_mul_v_s128_128_640(&mStack_c0,key,precomputed_round_key_matrix_non_linear_part);
      mzd_xor_s128_640(&mStack_c0,&mStack_c0,precomputed_constant_non_linear_part);
      bVar8 = 0;
      uVar4 = 0;
      do {
        uVar1 = mStack_100.w64[1] * 4;
        uVar7 = mStack_100.w64[1] & 0x9249249000000000;
        uVar5 = mStack_100.w64[1] * 2 & 0x9249249000000000;
        mStack_100.w64[1] =
             *(long *)((long)(&mStack_c0)[uVar4 >> 3].w64 + (ulong)(uVar4 & 6) * 4) <<
             (~bVar8 & 0x20) & 0xffffffff00000000U ^ (uVar5 ^ 0x9249249000000000) & uVar1 ^ uVar7 ^
             (((uVar7 ^ 0x9249249000000000) & uVar1 ^ uVar5) >> 1 |
             (mStack_100.w64[1] * 2 & uVar7 ^ uVar1 & 0x9249249000000000) >> 2 |
             mStack_100.w64[1] & 0x3ffffffff) ^ uVar5;
        mzd_mul_v_parity_uint64_128_30(&mStack_e0,&mStack_100,plVar9->z_matrix);
        mzd_shuffle_128_30(&mStack_100,plVar9->r_mask);
        mzd_addmul_v_s128_30_128(&mStack_e0,&mStack_100,plVar9->r_matrix);
        mStack_100.w64[1] = mStack_100.w64[1] & 0x3ffffffff;
        mzd_xor_s128_128(&mStack_100,&mStack_e0,&mStack_100);
        uVar4 = uVar4 + 1;
        plVar9 = plVar9 + 1;
        bVar8 = bVar8 + 0x20;
      } while (uVar4 != 0x13);
      uVar1 = mStack_100.w64[1] * 4;
      uVar7 = mStack_100.w64[1] & 0x9249249000000000;
      uVar5 = mStack_100.w64[1] * 2 & 0x9249249000000000;
      mStack_100.w64[1] =
           amStack_80[0].w64[1] & 0xffffffff00000000 ^ (uVar5 ^ 0x9249249000000000) & uVar1 ^ uVar7
           ^ (((uVar7 ^ 0x9249249000000000) & uVar1 ^ uVar5) >> 1 |
             (mStack_100.w64[1] * 2 & uVar7 ^ uVar1 & 0x9249249000000000) >> 2 |
             mStack_100.w64[1] & 0x3ffffffff) ^ uVar5;
      mzd_mul_v_s128_128(&mStack_e0,&mStack_100,Z_r);
      mzd_copy_s128_128(&mStack_100,&mStack_e0);
      mzd_copy_s128_128(y,&mStack_100);
      return;
    }
    if (uVar4 != 0x81002b) {
      lowmc_s128_lowmc_192_192_30(key,x,y);
      return;
    }
    mStack_e0.w64[3] = 0x105da2;
    mzd_copy_s128_256((mzd_local_t *)auStack_a0,x);
    mStack_e0.w64[3] = 0x105dbb;
    mzd_addmul_v_s128_129((mzd_local_t *)auStack_a0,key,K_0);
    lVar6 = 0;
    do {
      auVar13 = vandpd_avx(auStack_a0._0_16_,_DAT_0010d7e0);
      auVar21 = vpand_avx(auStack_a0._16_16_,_DAT_0010d7f0);
      auVar14 = vandpd_avx(auStack_a0._0_16_,_DAT_0010d800);
      auVar10 = vpand_avx(auStack_a0._16_16_,_DAT_0010d810);
      auVar22 = vandpd_avx(auStack_a0._0_16_,_DAT_0010d820);
      auVar2 = vpand_avx(auStack_a0._16_16_,_DAT_0010d830);
      auVar16 = vpsrldq_avx(auStack_a0._0_16_,8);
      auVar20 = vpsrldq_avx(auVar13,8);
      auVar10 = vpshldq_avx512_vbmi2(auVar10,auVar16,1);
      auVar14 = vpaddq_avx(auVar14,auVar14);
      auVar16 = vpshldq_avx512_vbmi2(auVar21,auVar20,2);
      auVar21 = vpslldq_avx(auVar13,8);
      auVar20 = vpshldq_avx512_vbmi2(auVar13,auVar21,2);
      auVar13 = vpand_avx(auVar16,auVar2);
      auVar11 = vpternlogq_avx512vl(auVar16,auVar10,auVar2,0x78);
      auVar12 = vpternlogq_avx512vl(auVar20,auVar14,auVar22,0x78);
      auVar23 = vpslldq_avx(auVar11,8);
      auVar21 = vpand_avx(auVar20,auVar22);
      auVar13 = vpternlogq_avx512vl(auVar13,auVar10,auVar16,0x96);
      auVar11 = vpsrlq_avx(auVar11,2);
      auVar24 = vpsrldq_avx(auVar12,8);
      auVar21 = vpternlogq_avx512vl(auVar21,auVar14,auVar20,0x96);
      auVar23 = vpsllq_avx(auVar23,0x3e);
      auVar10 = vpternlogq_avx512vl(auVar11,auVar10,auVar16,0xfe);
      auVar16 = vpshldq_avx512_vbmi2(auVar24,auVar12,0x3e);
      auVar11 = vpslldq_avx(auVar13,8);
      auVar13 = vpsrlq_avx(auVar13,1);
      auVar21 = vpshldq_avx512_vbmi2(auVar11,auVar21,0x3f);
      auStack_a0._16_16_ = vpternlogq_avx512vl(auVar10,auVar2,auVar13,0x96);
      auVar13 = vpor_avx(auVar16,auVar23);
      auVar13 = vpternlogq_avx512vl(auVar13,auVar20,auVar14,0xfe);
      auStack_a0._0_16_ = vpternlogq_avx512vl(auVar13,auVar22,auVar21,0x96);
      mStack_e0.w64[3] = 0x105ebf;
      mzd_mul_v_s128_129(amStack_80,(mzd_local_t *)auStack_a0,
                         *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar6));
      mStack_e0.w64[3] = 0x105ecf;
      mzd_xor_s128_256((mzd_local_t *)auStack_a0,amStack_80,
                       *(mzd_local_t **)((long)&rounds[0].constant + lVar6));
      mStack_e0.w64[3] = 0x105edf;
      mzd_addmul_v_s128_129
                ((mzd_local_t *)auStack_a0,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar6))
      ;
      lVar6 = lVar6 + 0x20;
    } while ((int)lVar6 != 0x80);
    mStack_e0.w64[3] = 0x105efe;
    mzd_copy_s128_256((mzd_local_t *)mStack_c0.w64[3],(mzd_local_t *)auStack_a0);
    return;
  }
  if (0xc0003f < (int)uVar4) {
    if (uVar4 == 0xc00040) {
      mStack_e0.w64[3] = 0x10545a;
      mzd_copy_s256_256((mzd_local_t *)auStack_a0,x);
      mStack_e0.w64[3] = 0x105473;
      mzd_addmul_v_s256_192((mzd_local_t *)auStack_a0,key,K_0);
      lVar6 = 0;
      do {
        auVar17 = vpand_avx2(auStack_a0,_DAT_0010d700);
        auVar18 = vpand_avx2(auStack_a0,_DAT_0010d720);
        auVar3 = vpand_avx2(auStack_a0,_DAT_0010d740);
        auVar19 = vpsllq_avx2(auVar17,2);
        auVar17 = vpsrlq_avx2(auVar17,0x3e);
        auVar17 = vpermq_avx2(auVar17,0x93);
        auVar19 = vpor_avx2(auVar17,auVar19);
        auVar17 = vpaddq_avx2(auVar18,auVar18);
        auVar18 = vpsrlq_avx2(auVar18,0x3f);
        auVar18 = vpermq_avx2(auVar18,0x93);
        auVar18 = vpor_avx2(auVar18,auVar17);
        auVar17 = vpand_avx2(auVar19,auVar3);
        auVar15 = vpternlogq_avx512vl(auVar17,auVar18,auVar19,0x96);
        auVar17 = vpor_avx2(auVar19,auVar18);
        auVar18 = vpternlogq_avx512vl(auVar19,auVar18,auVar3,0x78);
        auVar19 = vpsrlq_avx2(auVar18,2);
        auVar18 = vpsllq_avx2(auVar18,0x3e);
        auVar18 = vpermq_avx2(auVar18,0x39);
        auVar18 = vpternlogq_avx512vl(auVar18,auVar17,auVar19,0x36);
        auVar19 = vpsrlq_avx2(auVar15,1);
        auVar17 = vpsllq_avx2(auVar15,0x3f);
        auVar17 = vpermq_avx2(auVar17,0x39);
        auVar17 = vpor_avx2(auVar17,auVar19);
        auStack_a0 = vpternlogq_avx512vl(auVar17,auVar3,auVar18,0x96);
        mStack_e0.w64[3] = 0x105520;
        mzd_mul_v_s256_192(amStack_80,(mzd_local_t *)auStack_a0,
                           *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar6));
        mStack_e0.w64[3] = 0x105530;
        mzd_xor_s256_256((mzd_local_t *)auStack_a0,amStack_80,
                         *(mzd_local_t **)((long)&rounds[0].constant + lVar6));
        mStack_e0.w64[3] = 0x105540;
        mzd_addmul_v_s256_192
                  ((mzd_local_t *)auStack_a0,key,
                   *(mzd_local_t **)((long)&rounds[0].k_matrix + lVar6));
        lVar6 = lVar6 + 0x20;
      } while ((int)lVar6 != 0x80);
      mStack_e0.w64[3] = 0x10555f;
      mzd_copy_s256_256((mzd_local_t *)mStack_c0.w64[3],(mzd_local_t *)auStack_a0);
      return;
    }
    if (uVar4 != 0xff0055) {
      lowmc_s256_lowmc_256_256_38(key,x,y);
      return;
    }
    mStack_e0.w64[3] = 0x10559b;
    mzd_copy_s256_256((mzd_local_t *)auStack_a0,x);
    mStack_e0.w64[3] = 0x1055b4;
    mzd_addmul_v_s256_256((mzd_local_t *)auStack_a0,key,K_0);
    lVar6 = 0;
    do {
      auVar17 = vpand_avx2(auStack_a0,_DAT_0010d760);
      auVar18 = vpand_avx2(auStack_a0,_DAT_0010d780);
      auVar3 = vpand_avx2(auStack_a0,_DAT_0010d7a0);
      auVar19 = vpsllq_avx2(auVar17,2);
      auVar17 = vpsrlq_avx2(auVar17,0x3e);
      auVar17 = vpermq_avx2(auVar17,0x93);
      auVar19 = vpor_avx2(auVar17,auVar19);
      auVar17 = vpaddq_avx2(auVar18,auVar18);
      auVar18 = vpsrlq_avx2(auVar18,0x3f);
      auVar18 = vpermq_avx2(auVar18,0x93);
      auVar18 = vpor_avx2(auVar18,auVar17);
      auVar17 = vpand_avx2(auVar19,auVar3);
      auVar15 = vpternlogq_avx512vl(auVar17,auVar18,auVar19,0x96);
      auVar17 = vpor_avx2(auVar19,auVar18);
      auVar18 = vpternlogq_avx512vl(auVar19,auVar18,auVar3,0x78);
      auVar19 = vpsrlq_avx2(auVar18,2);
      auVar18 = vpsllq_avx2(auVar18,0x3e);
      auVar18 = vpermq_avx2(auVar18,0x39);
      auVar18 = vpternlogq_avx512vl(auVar18,auVar17,auVar19,0x36);
      auVar19 = vpsrlq_avx2(auVar15,1);
      auVar17 = vpsllq_avx2(auVar15,0x3f);
      auVar17 = vpermq_avx2(auVar17,0x39);
      auVar17 = vpor_avx2(auVar17,auVar19);
      auStack_a0 = vpternlogq_avx512vl(auVar17,auVar3,auVar18,0x96);
      mStack_e0.w64[3] = 0x105661;
      mzd_mul_v_s256_256(amStack_80,(mzd_local_t *)auStack_a0,
                         *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar6));
      mStack_e0.w64[3] = 0x105671;
      mzd_xor_s256_256((mzd_local_t *)auStack_a0,amStack_80,
                       *(mzd_local_t **)((long)&rounds[0].constant + lVar6));
      mStack_e0.w64[3] = 0x105681;
      mzd_addmul_v_s256_256
                ((mzd_local_t *)auStack_a0,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar6))
      ;
      lVar6 = lVar6 + 0x20;
    } while ((int)lVar6 != 0x80);
    mStack_e0.w64[3] = 0x1056a0;
    mzd_copy_s256_256((mzd_local_t *)mStack_c0.w64[3],(mzd_local_t *)auStack_a0);
    return;
  }
  if (uVar4 == 0x80000a) {
    mzd_xor_s256_128(&mStack_100,x,precomputed_constant_linear_part);
    plVar9 = rounds;
    mzd_addmul_v_s256_128(&mStack_100,key,precomputed_round_key_matrix_linear_part);
    mzd_mul_v_s256_128_768(&mStack_c0,key,precomputed_round_key_matrix_non_linear_part);
    mzd_xor_s256_768(&mStack_c0,&mStack_c0,precomputed_constant_non_linear_part);
    bVar8 = 0;
    uVar4 = 0;
    do {
      uVar1 = mStack_100.w64[1] * 4;
      uVar7 = mStack_100.w64[1] & 0x9249249000000000;
      uVar5 = mStack_100.w64[1] * 2 & 0x9249249000000000;
      mStack_100.w64[1] =
           *(long *)((long)(&mStack_c0)[uVar4 >> 3].w64 + (ulong)(uVar4 & 6) * 4) << (~bVar8 & 0x20)
           & 0xffffffff00000000U ^ (uVar5 ^ 0x9249249000000000) & uVar1 ^ uVar7 ^
           (((uVar7 ^ 0x9249249000000000) & uVar1 ^ uVar5) >> 1 |
           (mStack_100.w64[1] * 2 & uVar7 ^ uVar1 & 0x9249249000000000) >> 2 |
           mStack_100.w64[1] & 0x3ffffffff) ^ uVar5;
      mzd_mul_v_parity_uint64_128_30(&mStack_e0,&mStack_100,plVar9->z_matrix);
      mzd_shuffle_pext_128_30(&mStack_100,plVar9->r_mask);
      mzd_addmul_v_s256_30_128(&mStack_e0,&mStack_100,plVar9->r_matrix);
      mStack_100.w64[1] = mStack_100.w64[1] & 0x3ffffffff;
      mzd_xor_s256_128(&mStack_100,&mStack_e0,&mStack_100);
      uVar4 = uVar4 + 1;
      plVar9 = plVar9 + 1;
      bVar8 = bVar8 + 0x20;
    } while (uVar4 != 0x13);
    uVar1 = mStack_100.w64[1] * 4;
    uVar7 = mStack_100.w64[1] & 0x9249249000000000;
    uVar5 = mStack_100.w64[1] * 2 & 0x9249249000000000;
    mStack_100.w64[1] =
         amStack_80[0].w64[1] & 0xffffffff00000000 ^ (uVar5 ^ 0x9249249000000000) & uVar1 ^ uVar7 ^
         (((uVar7 ^ 0x9249249000000000) & uVar1 ^ uVar5) >> 1 |
         (mStack_100.w64[1] * 2 & uVar7 ^ uVar1 & 0x9249249000000000) >> 2 |
         mStack_100.w64[1] & 0x3ffffffff) ^ uVar5;
    mzd_mul_v_s256_128(&mStack_e0,&mStack_100,Z_r);
    mzd_copy_s256_128(&mStack_100,&mStack_e0);
    mzd_copy_s256_128(y,&mStack_100);
    return;
  }
  if (uVar4 != 0x81002b) {
    lowmc_s256_lowmc_192_192_30(key,x,y);
    return;
  }
  mStack_e0.w64[3] = 0x105319;
  mzd_copy_s256_256((mzd_local_t *)auStack_a0,x);
  mStack_e0.w64[3] = 0x105332;
  mzd_addmul_v_s256_129((mzd_local_t *)auStack_a0,key,K_0);
  lVar6 = 0;
  do {
    auVar17 = vpand_avx2(auStack_a0,_DAT_0010d6a0);
    auVar18 = vpand_avx2(auStack_a0,_DAT_0010d6c0);
    auVar3 = vpand_avx2(auStack_a0,_DAT_0010d6e0);
    auVar19 = vpsllq_avx2(auVar17,2);
    auVar17 = vpsrlq_avx2(auVar17,0x3e);
    auVar17 = vpermq_avx2(auVar17,0x93);
    auVar19 = vpor_avx2(auVar17,auVar19);
    auVar17 = vpaddq_avx2(auVar18,auVar18);
    auVar18 = vpsrlq_avx2(auVar18,0x3f);
    auVar18 = vpermq_avx2(auVar18,0x93);
    auVar18 = vpor_avx2(auVar18,auVar17);
    auVar17 = vpand_avx2(auVar19,auVar3);
    auVar15 = vpternlogq_avx512vl(auVar17,auVar18,auVar19,0x96);
    auVar17 = vpor_avx2(auVar19,auVar18);
    auVar18 = vpternlogq_avx512vl(auVar19,auVar18,auVar3,0x78);
    auVar19 = vpsrlq_avx2(auVar18,2);
    auVar18 = vpsllq_avx2(auVar18,0x3e);
    auVar18 = vpermq_avx2(auVar18,0x39);
    auVar18 = vpternlogq_avx512vl(auVar18,auVar17,auVar19,0x36);
    auVar19 = vpsrlq_avx2(auVar15,1);
    auVar17 = vpsllq_avx2(auVar15,0x3f);
    auVar17 = vpermq_avx2(auVar17,0x39);
    auVar17 = vpor_avx2(auVar17,auVar19);
    auStack_a0 = vpternlogq_avx512vl(auVar17,auVar3,auVar18,0x96);
    mStack_e0.w64[3] = 0x1053df;
    mzd_mul_v_s256_129(amStack_80,(mzd_local_t *)auStack_a0,
                       *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar6));
    mStack_e0.w64[3] = 0x1053ef;
    mzd_xor_s256_256((mzd_local_t *)auStack_a0,amStack_80,
                     *(mzd_local_t **)((long)&rounds[0].constant + lVar6));
    mStack_e0.w64[3] = 0x1053ff;
    mzd_addmul_v_s256_129
              ((mzd_local_t *)auStack_a0,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar6));
    lVar6 = lVar6 + 0x20;
  } while ((int)lVar6 != 0x80);
  mStack_e0.w64[3] = 0x10541e;
  mzd_copy_s256_256((mzd_local_t *)mStack_c0.w64[3],(mzd_local_t *)auStack_a0);
  return;
}

Assistant:

static inline ATTR_PURE uint32_t lowmc_get_id(const lowmc_parameters_t* lowmc) {
  return LOWMC_ID(lowmc->n, lowmc->m);
}